

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O1

Section * __thiscall asmjit::v1_14::CodeHolder::ensureAddressTableSection(CodeHolder *this)

{
  if (this->_addressTableSection != (Section *)0x0) {
    return this->_addressTableSection;
  }
  newSection(this,&this->_addressTableSection,".addrtab",8,kNone,
             (uint)(((this->_environment)._arch & k32BitMask) == kUnknown) * 4 + 4,0x7fffffff);
  return this->_addressTableSection;
}

Assistant:

Section* CodeHolder::ensureAddressTableSection() noexcept {
  if (_addressTableSection)
    return _addressTableSection;

  newSection(&_addressTableSection,
             CodeHolder_addrTabName,
             sizeof(CodeHolder_addrTabName) - 1,
             SectionFlags::kNone,
             _environment.registerSize(),
             std::numeric_limits<int32_t>::max());
  return _addressTableSection;
}